

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostAddress_p.cpp
# Opt level: O2

bool BamTools::Internal::ParseIp4(string *address,uint32_t *maybeIp4)

{
  char *pcVar1;
  uint uVar2;
  reference pvVar3;
  size_t j;
  size_type sVar4;
  uint uVar5;
  uint8_t i;
  size_type __n;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addressFields;
  
  Split(&addressFields,address,'.');
  uVar5 = 0;
  if ((long)addressFields.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)addressFields.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x80) {
    for (__n = 0; __n != 4; __n = __n + 1) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&addressFields,__n);
      sVar4 = 0;
      while (pvVar3->_M_string_length != sVar4) {
        pcVar1 = (pvVar3->_M_dataplus)._M_p + sVar4;
        sVar4 = sVar4 + 1;
        if (9 < (int)*pcVar1 - 0x30U) goto LAB_001521ba;
      }
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&addressFields,__n);
      uVar2 = atoi((pvVar3->_M_dataplus)._M_p);
      if (0xff < uVar2) {
LAB_001521ba:
        uVar5 = 0;
        goto LAB_001521bc;
      }
      uVar5 = uVar5 << 8 | uVar2;
    }
    *maybeIp4 = uVar5;
    uVar5 = 1;
  }
LAB_001521bc:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&addressFields);
  return SUB41(uVar5,0);
}

Assistant:

static
bool ParseIp4(const string& address, uint32_t& maybeIp4 ) {

    // split IP address into string fields
    vector<string> addressFields = Split(address, '.');
    if ( addressFields.size() != 4 )
        return false;

    // convert each field to integer value
    uint32_t ipv4(0);
    for ( uint8_t i = 0; i < 4; ++i ) {

        const string& field = addressFields.at(i);
        const size_t fieldSize = field.size();
        for ( size_t j = 0; j < fieldSize; ++j ) {
            if ( !isdigit(field[j]) )
                return false;
        }

        int value = atoi( addressFields.at(i).c_str() );
        if ( value < 0 || value > 255 )
            return false;

        // append byte value
        ipv4 <<= 8;
        ipv4 += value;
    }

    // store 32-bit IP address & return success
    maybeIp4 = ipv4;
    return true;
}